

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O0

void __thiscall
wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>::handleCall<wasm::CallRef>
          (SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping> *this,CallRef *curr,
          Signature sig)

{
  Expression *sub;
  Type sub_00;
  size_t sVar1;
  size_t sVar2;
  Unsubtyping *pUVar3;
  Expression **ppEVar4;
  Type *pTVar5;
  Unsubtyping *pUVar6;
  Function *this_00;
  Type super;
  size_t size;
  size_t i;
  CallRef *curr_local;
  SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping> *this_local;
  Signature sig_local;
  
  sig_local.params = sig.results.id;
  this_local = (SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping> *)sig.params.id;
  sVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->operands).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  sVar2 = wasm::Type::size((Type *)&this_local);
  if (sVar1 == sVar2) {
    size = 0;
    sVar1 = wasm::Type::size((Type *)&this_local);
    for (; size < sVar1; size = size + 1) {
      pUVar3 = self(this);
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(curr->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,size);
      sub = *ppEVar4;
      pTVar5 = wasm::Type::operator[]((Type *)&this_local,size);
      anon_unknown_22::Unsubtyping::noteSubtype(pUVar3,sub,(Type)pTVar5->id);
    }
    if ((curr->isReturn & 1U) != 0) {
      pUVar3 = self(this);
      sub_00 = sig_local.params;
      pUVar6 = self(this);
      this_00 = Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                ::getFunction((Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                               *)&(pUVar6->
                                  super_WalkerPass<wasm::ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>_>
                                  ).
                                  super_ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                             );
      super = Function::getResults(this_00);
      anon_unknown_22::Unsubtyping::noteSubtype(pUVar3,sub_00,super);
    }
    return;
  }
  __assert_fail("curr->operands.size() == sig.params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/subtype-exprs.h"
                ,0x90,
                "void wasm::SubtypingDiscoverer<wasm::(anonymous namespace)::Unsubtyping>::handleCall(T *, Signature) [SubType = wasm::(anonymous namespace)::Unsubtyping, T = wasm::CallRef]"
               );
}

Assistant:

void handleCall(T* curr, Signature sig) {
    assert(curr->operands.size() == sig.params.size());
    for (size_t i = 0, size = sig.params.size(); i < size; ++i) {
      self()->noteSubtype(curr->operands[i], sig.params[i]);
    }
    if (curr->isReturn) {
      self()->noteSubtype(sig.results, self()->getFunction()->getResults());
    }
  }